

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest5::executeIteration
          (NegativeTest5 *this,_shader_stage *shader_stage)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_250;
  uint local_cc;
  undefined1 local_c8 [8];
  string vs_body;
  string te_body;
  string tc_body;
  undefined1 local_58 [8];
  string gs_body;
  string fs_body;
  _shader_stage *shader_stage_local;
  NegativeTest5 *this_local;
  
  getFragmentShaderBody_abi_cxx11_
            ((string *)((long)&gs_body.field_2 + 8),this,*shader_stage == SHADER_STAGE_FRAGMENT);
  getGeometryShaderBody_abi_cxx11_((string *)local_58,this,*shader_stage == SHADER_STAGE_GEOMETRY);
  getTessellationControlShaderBody_abi_cxx11_
            ((string *)((long)&te_body.field_2 + 8),this,
             *shader_stage == SHADER_STAGE_TESSELLATION_CONTROL);
  getTessellationEvaluationShaderBody_abi_cxx11_
            ((string *)((long)&vs_body.field_2 + 8),this,
             *shader_stage == SHADER_STAGE_TESSELLATION_EVALUATION);
  getVertexShaderBody_abi_cxx11_((string *)local_c8,this,*shader_stage == SHADER_STAGE_FIRST);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_cc = 0;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),(string *)local_c8,
                              (string *)((long)&te_body.field_2 + 8),
                              (string *)((long)&vs_body.field_2 + 8),(string *)local_58,
                              (string *)((long)&gs_body.field_2 + 8),(GLchar **)0x0,&local_cc,
                              &this->m_vs_id,&this->m_tc_id,&this->m_te_id,&this->m_gs_id,
                              &this->m_fs_id,&this->m_po_id);
  if (bVar1) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_250,
                        (char (*) [284])
                        "A program object, consisting of the following shaders, has linked correctly. One of the shaders defines a subroutine uniform but does not implement any function that matches subroutine type of the uniform. This should have resulted in a compilation/link-time error.\n\nVertex shader:\n\n"
                       );
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [32])0x2a14d51);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&te_body.field_2 + 8));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [35])0x2a14d72);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&vs_body.field_2 + 8));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])0x2a14d96);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])0x2a14dab);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&gs_body.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
    this->m_has_test_passed = false;
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(gs_body.field_2._M_local_buf + 8));
  return;
}

Assistant:

void NegativeTest5::executeIteration(const Utils::_shader_stage& shader_stage)
{
	std::string fs_body = getFragmentShaderBody(shader_stage == Utils::SHADER_STAGE_FRAGMENT);
	std::string gs_body = getGeometryShaderBody(shader_stage == Utils::SHADER_STAGE_GEOMETRY);
	std::string tc_body = getTessellationControlShaderBody(shader_stage == Utils::SHADER_STAGE_TESSELLATION_CONTROL);
	std::string te_body =
		getTessellationEvaluationShaderBody(shader_stage == Utils::SHADER_STAGE_TESSELLATION_EVALUATION);
	std::string vs_body = getVertexShaderBody(shader_stage == Utils::SHADER_STAGE_VERTEX);

	if (Utils::buildProgram(m_context.getRenderContext().getFunctions(), vs_body, tc_body, te_body, gs_body, fs_body,
							DE_NULL, /* xfb_varyings */
							DE_NULL, /* n_xfb_varyings */
							&m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		/* None of the test programs should ever build successfully */
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A program object, consisting of the following shaders, has linked"
							  " correctly. One of the shaders defines a subroutine uniform but does "
							  "not implement any function that matches subroutine type of the uniform."
							  " This should have resulted in a compilation/link-time error.\n"
							  "\n"
							  "Vertex shader:\n"
							  "\n"
						   << vs_body << "\n"
										 "Tessellation control shader:\n"
										 "\n"
						   << tc_body << "\n"
										 "Tessellation evaluation shader:\n"
										 "\n"
						   << te_body << "\n"
										 "Geometry shader:\n"
										 "\n"
						   << gs_body << "\n"
										 "Fragment shader:\n"
										 "\n"
						   << fs_body << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}
}